

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::DeriveData(PClassActor *this,PClass *newclass)

{
  undefined2 uVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  PType *this_00;
  PSymbolTable *this_01;
  bool bVar5;
  
  pPVar2 = RegistrationInfo.MyClass;
  if ((newclass->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.Class
      == (PClass *)0x0) {
    iVar3 = (**(newclass->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
               super_DObject._vptr_DObject)(newclass);
    (newclass->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar4 = (newclass->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_DObject.
           Class;
  bVar5 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar2 && bVar5) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar5 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar2) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar5) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                  ,0x119,"virtual void PClassActor::DeriveData(PClass *)");
  }
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Symbols.Symbols.Size,&this->Obituary);
  FString::operator=((FString *)
                     &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      Conversions,&this->HitObituary);
  *(double *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Conversions.Most =
       this->DeathHeight;
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.PredType =
       (PType *)this->BurnHeight;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.VisitNext =
       (this->BloodColor).field_0;
  *(int *)((long)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                  VisitNext + 4) = this->GibHealth;
  uVar1 = *(undefined2 *)((long)&this->WoundHealth + 2);
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.PredConv =
       *(undefined2 *)&this->WoundHealth;
  newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Distance = uVar1;
  *(int *)&newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.field_0x7c =
       this->PoisonDamage;
  newclass[1].super_PStruct.super_PNamedType.Outer = (DObject *)this->FastSpeed;
  *(double *)&newclass[1].super_PStruct.super_PNamedType.TypeName = this->RDFactor;
  newclass[1].super_PStruct.Fields.Array = (PField **)this->CameraHeight;
  newclass[1].super_PStruct.Fields.Most = (this->HowlSound).ID;
  newclass[1].super_PStruct.Fields.Count = (this->BloodType).Index;
  *(int *)&newclass[1].SpecialInits.Array = (this->BloodType2).Index;
  *(int *)((long)&newclass[1].SpecialInits.Array + 4) = (this->BloodType3).Index;
  newclass[1].Pointers = (size_t *)this->distancecheck;
  *(DDropItem **)&newclass[1].SpecialInits.Most = this->DropItems;
  *(bool *)&newclass[1].FlatPointers = this->DontHurtShooter;
  *(int *)((long)&newclass[1].FlatPointers + 4) = this->ExplosionRadius;
  *(int *)&newclass[1].Defaults = this->ExplosionDamage;
  *(int *)((long)&newclass[1].Defaults + 4) = this->MeleeDamage;
  *(int *)&newclass[1].bRuntimeClass = (this->MeleeSound).ID;
  *(int *)&newclass[1].field_0xd4 = (this->MissileName).Index;
  newclass[1].ConstructNative = (_func_void_void_ptr *)this->MissileHeight;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
            ((TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *)
             &newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
              Symbols,&this->VisibleToPlayerClass);
  if (this->DamageFactors != (DmgFactors *)0x0) {
    this_00 = (PType *)operator_new(0x18);
    *(hash_t *)((long)&(this_00->super_DObject).ObjNext + 4) = 0;
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::SetNodeVector
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this_00,1);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext = this_00;
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::operator=
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this_00,
               &this->DamageFactors->
                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>);
  }
  if (this->PainChances != (PainChanceList *)0x0) {
    this_01 = (PSymbolTable *)operator_new(0x18);
    *(hash_t *)((long)&(this_01->Symbols).LastFree + 4) = 0;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::SetNodeVector
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_01,1);
    newclass[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.Symbols.
    ParentSymbolTable = this_01;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_01,this->PainChances
              );
    return;
  }
  return;
}

Assistant:

void PClassActor::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassActor)));
	PClassActor *newa = static_cast<PClassActor *>(newclass);

	newa->Obituary = Obituary;
	newa->HitObituary = HitObituary;
	newa->DeathHeight = DeathHeight;
	newa->BurnHeight = BurnHeight;
	newa->BloodColor = BloodColor;
	newa->GibHealth = GibHealth;
	newa->WoundHealth = WoundHealth;
	newa->PoisonDamage = PoisonDamage;
	newa->FastSpeed = FastSpeed;
	newa->RDFactor = RDFactor;
	newa->CameraHeight = CameraHeight;
	newa->HowlSound = HowlSound;
	newa->BloodType = BloodType;
	newa->BloodType2 = BloodType2;
	newa->BloodType3 = BloodType3;
	newa->distancecheck = distancecheck;

	newa->DropItems = DropItems;

	newa->DontHurtShooter = DontHurtShooter;
	newa->ExplosionRadius = ExplosionRadius;
	newa->ExplosionDamage = ExplosionDamage;
	newa->MeleeDamage = MeleeDamage;
	newa->MeleeSound = MeleeSound;
	newa->MissileName = MissileName;
	newa->MissileHeight = MissileHeight;

	newa->VisibleToPlayerClass = VisibleToPlayerClass;

	if (DamageFactors != NULL)
	{
		// copy damage factors from parent
		newa->DamageFactors = new DmgFactors;
		*newa->DamageFactors = *DamageFactors;
	}
	if (PainChances != NULL)
	{
		// copy pain chances from parent
		newa->PainChances = new PainChanceList;
		*newa->PainChances = *PainChances;
	}

}